

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRHS.cpp
# Opt level: O3

void __thiscall
HEkkDualRHS::chooseMultiHyperGraphPart
          (HEkkDualRHS *this,HighsInt *chIndex,HighsInt *chCount,HighsInt chLimit)

{
  double dVar1;
  double dVar2;
  int iVar3;
  HEkk *pHVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer piVar7;
  uint uVar8;
  bool bVar9;
  uint32_t uVar10;
  bool bVar11;
  ulong uVar12;
  int iVar13;
  uint32_t uVar14;
  long lVar15;
  uint uVar16;
  uint32_t uVar17;
  vector<int,_std::allocator<int>_> bestIndex;
  vector<double,_std::allocator<double>_> bestMerit;
  allocator_type local_79;
  uint local_78;
  value_type_conflict2 local_74;
  int *local_70;
  vector<int,_std::allocator<int>_> local_68;
  vector<double,_std::allocator<double>_> local_50;
  HighsInt *local_38;
  
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x26,0);
  if (this->partNum != chLimit) {
    chooseMultiGlobal(this,chIndex,chCount,chLimit);
    this->partSwitch = 0;
LAB_003536a6:
    HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x26,0);
    return;
  }
  if (0 < chLimit) {
    memset(chIndex,0xff,(ulong)(uint)chLimit << 2);
  }
  *chCount = 0;
  pHVar4 = this->ekk_instance_;
  uVar10 = this->workCount;
  local_78 = chLimit;
  if ((int)uVar10 < 0) {
    uVar16 = -uVar10;
    uVar17 = 0;
    if (1 < uVar16) {
      uVar8 = 0x1f;
      if (~uVar10 != 0) {
        for (; ~uVar10 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar17 = HighsRandom::drawUniform(&pHVar4->random_,uVar16,(uVar8 ^ 0xffffffe0) + 0x21);
    }
    local_70 = (int *)(long)(int)local_78;
    local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_50,(size_type)local_70,(value_type_conflict1 *)&local_68,
               (allocator_type *)&local_74);
    local_74 = -1;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_68,(size_type)local_70,&local_74,&local_79);
    pdVar6 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar9 = true;
    do {
      bVar11 = bVar9;
      uVar14 = uVar17;
      uVar10 = 0;
      if (bVar11) {
        uVar14 = uVar16;
        uVar10 = uVar17;
      }
      if ((int)uVar10 < (int)uVar14) {
        piVar5 = (this->workPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar15 = (long)(int)uVar10;
        do {
          dVar1 = pdVar6[lVar15];
          if (1e-50 < dVar1) {
            iVar13 = piVar5[lVar15];
            dVar2 = (pHVar4->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar15];
            if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar13] * dVar2 < dVar1) {
              local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar13] = dVar1 / dVar2;
              local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar13] = (int)lVar15;
            }
          }
          lVar15 = lVar15 + 1;
        } while ((int)uVar14 != lVar15);
      }
      bVar9 = false;
    } while (bVar11);
    if ((int)local_78 < 1) {
      *chCount = 0;
      goto LAB_0035392c;
    }
    uVar12 = 0;
    iVar13 = 0;
    do {
      if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar12] != -1) {
        lVar15 = (long)iVar13;
        iVar13 = iVar13 + 1;
        chIndex[lVar15] =
             local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar12];
      }
      uVar12 = uVar12 + 1;
    } while (local_78 != uVar12);
    *chCount = iVar13;
  }
  else {
    if (uVar10 == 1) {
      uVar10 = 0;
    }
    else {
      if (uVar10 == 0) goto LAB_003536a6;
      uVar16 = 0x1f;
      if (uVar10 - 1 != 0) {
        for (; uVar10 - 1 >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      uVar10 = HighsRandom::drawUniform(&pHVar4->random_,uVar10,(uVar16 ^ 0xffffffe0) + 0x21);
    }
    local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_70 = chCount;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_50,(long)chLimit,(value_type_conflict1 *)&local_68,(allocator_type *)&local_74
              );
    local_74 = -1;
    local_38 = chIndex;
    std::vector<int,_std::allocator<int>_>::vector(&local_68,(long)chLimit,&local_74,&local_79);
    piVar5 = (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar9 = true;
    do {
      bVar11 = bVar9;
      uVar17 = uVar10;
      uVar14 = 0;
      if (bVar11) {
        uVar17 = this->workCount;
        uVar14 = uVar10;
      }
      if ((int)uVar14 < (int)uVar17) {
        piVar7 = (this->workPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar15 = (long)(int)uVar14;
        do {
          iVar13 = piVar5[lVar15];
          dVar1 = pdVar6[iVar13];
          if (1e-50 < dVar1) {
            iVar3 = piVar7[iVar13];
            dVar2 = (pHVar4->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar13];
            if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar3] * dVar2 < dVar1) {
              local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar3] = dVar1 / dVar2;
              local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar3] = iVar13;
            }
          }
          lVar15 = lVar15 + 1;
        } while ((int)uVar17 != lVar15);
      }
      bVar9 = false;
    } while (bVar11);
    if ((int)local_78 < 1) {
      *local_70 = 0;
LAB_0035392c:
      if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start == (pointer)0x0) goto LAB_00353936;
    }
    else {
      uVar12 = 0;
      iVar13 = 0;
      do {
        if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar12] != -1) {
          lVar15 = (long)iVar13;
          iVar13 = iVar13 + 1;
          local_38[lVar15] =
               local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar12];
        }
        uVar12 = uVar12 + 1;
      } while (local_78 != uVar12);
      *local_70 = iVar13;
    }
  }
  operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start);
LAB_00353936:
  if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x26,0);
  return;
}

Assistant:

void HEkkDualRHS::chooseMultiHyperGraphPart(HighsInt* chIndex,
                                            HighsInt* chCount,
                                            HighsInt chLimit) {
  analysis->simplexTimerStart(ChuzrDualClock);

  // Force to use partition method, unless doesn't exist
  if (partNum != chLimit) {
    chooseMultiGlobal(chIndex, chCount, chLimit);
    partSwitch = 0;
    analysis->simplexTimerStop(ChuzrDualClock);
    return;
  }

  // Initialise
  for (HighsInt i = 0; i < chLimit; i++) chIndex[i] = -1;
  *chCount = 0;

  std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
  if (workCount < 0) {
    // DENSE mode
    const HighsInt numRow = -workCount;
    HighsInt randomStart = ekk_instance_.random_.integer(numRow);
    vector<double> bestMerit(chLimit, 0);
    vector<HighsInt> bestIndex(chLimit, -1);
    for (HighsInt section = 0; section < 2; section++) {
      const HighsInt start = (section == 0) ? randomStart : 0;
      const HighsInt end = (section == 0) ? numRow : randomStart;
      for (HighsInt iRow = start; iRow < end; iRow++) {
        if (work_infeasibility[iRow] > kHighsZero) {
          HighsInt iPart = workPartition[iRow];
          const double myInfeas = work_infeasibility[iRow];
          const double myWeight = edge_weight[iRow];
          if (bestMerit[iPart] * myWeight < myInfeas) {
            bestMerit[iPart] = myInfeas / myWeight;
            bestIndex[iPart] = iRow;
          }
        }
      }
    }
    HighsInt count = 0;
    for (HighsInt i = 0; i < chLimit; i++) {
      if (bestIndex[i] != -1) {
        chIndex[count++] = bestIndex[i];
      }
    }
    *chCount = count;
  } else {
    // SPARSE mode
    if (workCount == 0) {
      analysis->simplexTimerStop(ChuzrDualClock);
      return;
    }

    HighsInt randomStart = ekk_instance_.random_.integer(workCount);
    vector<double> bestMerit(chLimit, 0);
    vector<HighsInt> bestIndex(chLimit, -1);
    for (HighsInt section = 0; section < 2; section++) {
      const HighsInt start = (section == 0) ? randomStart : 0;
      const HighsInt end = (section == 0) ? workCount : randomStart;
      for (HighsInt i = start; i < end; i++) {
        HighsInt iRow = workIndex[i];
        if (work_infeasibility[iRow] > kHighsZero) {
          HighsInt iPart = workPartition[iRow];
          const double myInfeas = work_infeasibility[iRow];
          const double myWeight = edge_weight[iRow];
          if (bestMerit[iPart] * myWeight < myInfeas) {
            bestMerit[iPart] = myInfeas / myWeight;
            bestIndex[iPart] = iRow;
          }
        }
      }
    }
    HighsInt count = 0;
    for (HighsInt i = 0; i < chLimit; i++) {
      if (bestIndex[i] != -1) {
        chIndex[count++] = bestIndex[i];
      }
    }
    *chCount = count;
  }

  analysis->simplexTimerStop(ChuzrDualClock);
}